

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::for_each_listen_socket
          (session_impl *this,function<void_(const_libtorrent::aux::listen_socket_handle_&)> *f)

{
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_50;
  __weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = &((this->m_listen_sockets).
             super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->m_listen_sockets).
                  super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,p_Var2);
    std::__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::listen_socket_t,void>(local_40,&local_50);
    std::function<void_(const_libtorrent::aux::listen_socket_handle_&)>::operator()
              (f,(listen_socket_handle *)local_40);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return;
}

Assistant:

void for_each_listen_socket(std::function<void(aux::listen_socket_handle const&)> f) override
			{
				for (auto& s : m_listen_sockets)
				{
					f(listen_socket_handle(s));
				}
			}